

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

void type_safe::
     with<type_safe::optional_variant_policy,int,double,debugger_type,C_A_T_C_H_T_E_S_T_0()::visitor&>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                *variant,visitor *func)

{
  int iVar1;
  unsigned_long uVar2;
  bool bVar3;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  AssertionHandler catchAssertionHandler;
  double local_e8;
  SourceLineInfo local_e0;
  ITransientExpression local_d0;
  visitor *local_c0;
  char *local_b8;
  size_t sStack_b0;
  undefined8 *local_a8;
  AssertionHandler local_a0;
  undefined8 local_58;
  undefined1 local_50 [16];
  StringRef local_40;
  
  uVar2 = (variant->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  local_c0 = func;
  if (uVar2 == 2) {
    tagged_union<int,_double,_debugger_type>::check<double>
              ((tagged_union<int,_double,_debugger_type> *)variant);
    local_e8 = *(double *)(variant->storage_).storage_.storage_.storage_;
    local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = false;
    local_d0._10_6_ = 0;
    local_e0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e0.line = 0x22f;
    Catch::StringRef::StringRef(&local_40,"i == 2");
    Catch::AssertionHandler::AssertionHandler
              (&local_a0,(StringRef *)&local_d0,&local_e0,local_40,Normal);
    local_50._0_4_ = 2;
    iVar1 = func->i;
    Catch::StringRef::StringRef((StringRef *)&local_e0,"==");
    local_d0.m_result = iVar1 == 2;
    local_d0.m_isBinaryExpression = true;
    local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f648;
    local_b8 = local_e0.file;
    sStack_b0 = local_e0.line;
    local_a8 = (undefined8 *)local_50;
    Catch::AssertionHandler::handleExpr(&local_a0,&local_d0);
    Catch::ITransientExpression::~ITransientExpression(&local_d0);
    Catch::AssertionHandler::complete(&local_a0);
    if (local_a0.m_completed == false) {
      (*(local_a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
    local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = false;
    local_d0._10_6_ = 0;
    local_e0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e0.line = 0x230;
    Catch::StringRef::StringRef((StringRef *)local_50,"f == 3.14");
    capturedExpression_00._4_12_ = local_50._4_12_;
    capturedExpression_00.m_start._0_4_ = local_50._0_4_;
    Catch::AssertionHandler::AssertionHandler
              (&local_a0,(StringRef *)&local_d0,&local_e0,capturedExpression_00,Normal);
    bVar3 = local_e8 == 3.14;
    local_58 = 0x40091eb851eb851f;
    Catch::StringRef::StringRef((StringRef *)&local_e0,"==");
    local_d0.m_result = bVar3;
    local_d0.m_isBinaryExpression = true;
    local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fbb0;
    local_b8 = local_e0.file;
    sStack_b0 = local_e0.line;
    local_c0 = (visitor *)&local_e8;
    local_a8 = &local_58;
    Catch::AssertionHandler::handleExpr(&local_a0,&local_d0);
    Catch::ITransientExpression::~ITransientExpression(&local_d0);
    Catch::AssertionHandler::complete(&local_a0);
    if (local_a0.m_completed == false) {
      (*(local_a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
  }
  else if (uVar2 == 1) {
    tagged_union<int,_double,_debugger_type>::check<int>
              ((tagged_union<int,_double,_debugger_type> *)variant);
    local_e8 = (double)CONCAT44(local_e8._4_4_,
                                *(undefined4 *)(variant->storage_).storage_.storage_.storage_);
    local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = false;
    local_d0._10_6_ = 0;
    local_e0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e0.line = 0x229;
    Catch::StringRef::StringRef(&local_40,"i == 1");
    Catch::AssertionHandler::AssertionHandler
              (&local_a0,(StringRef *)&local_d0,&local_e0,local_40,Normal);
    local_50._0_4_ = 1;
    iVar1 = func->i;
    Catch::StringRef::StringRef((StringRef *)&local_e0,"==");
    local_d0.m_result = iVar1 == 1;
    local_d0.m_isBinaryExpression = true;
    local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f648;
    local_b8 = local_e0.file;
    sStack_b0 = local_e0.line;
    local_a8 = (undefined8 *)local_50;
    Catch::AssertionHandler::handleExpr(&local_a0,&local_d0);
    Catch::ITransientExpression::~ITransientExpression(&local_d0);
    Catch::AssertionHandler::complete(&local_a0);
    if (local_a0.m_completed == false) {
      (*(local_a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
    local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = false;
    local_d0._10_6_ = 0;
    local_e0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e0.line = 0x22a;
    Catch::StringRef::StringRef((StringRef *)local_50,"val == 5");
    capturedExpression._4_12_ = local_50._4_12_;
    capturedExpression.m_start._0_4_ = local_50._0_4_;
    Catch::AssertionHandler::AssertionHandler
              (&local_a0,(StringRef *)&local_d0,&local_e0,capturedExpression,Normal);
    local_58 = CONCAT44(local_58._4_4_,5);
    iVar1 = local_e8._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_e0,"==");
    local_d0.m_result = iVar1 == 5;
    local_d0.m_isBinaryExpression = true;
    local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f648;
    local_b8 = local_e0.file;
    sStack_b0 = local_e0.line;
    local_c0 = (visitor *)&local_e8;
    local_a8 = &local_58;
    Catch::AssertionHandler::handleExpr(&local_a0,&local_d0);
    Catch::ITransientExpression::~ITransientExpression(&local_d0);
    Catch::AssertionHandler::complete(&local_a0);
    if (local_a0.m_completed == false) {
      (*(local_a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
  }
  return;
}

Assistant:

void with(basic_variant<VariantPolicy, Head, Types...>& variant, Func&& func,
          Args&&... additional_args)
{
    with(detail::storage_access::get(variant).get_union(), std::forward<Func>(func),
         std::forward<Args>(additional_args)...);
}